

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O0

el_action_t cv_repeat_srch(EditLine *el,wint_t c)

{
  el_action_t local_1c;
  wint_t c_local;
  EditLine *el_local;
  
  local_1c = (el_action_t)c;
  (el->el_state).lastcmd = local_1c;
  (el->el_line).lastchar = (el->el_line).buffer;
  if (c == 0x17) {
    el_local._7_1_ = ed_search_next_history(el,0);
  }
  else if (c == 0x18) {
    el_local._7_1_ = ed_search_prev_history(el,0);
  }
  else {
    el_local._7_1_ = '\x06';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
cv_repeat_srch(EditLine *el, wint_t c)
{

#ifdef SDEBUG
	static ct_buffer_t conv;
	(void) fprintf(el->el_errfile, "dir %d patlen %ld patbuf %s\n",
	    c, el->el_search.patlen, ct_encode_string(el->el_search.patbuf, &conv));
#endif

	el->el_state.lastcmd = (el_action_t) c;	/* Hack to stop c_setpat */
	el->el_line.lastchar = el->el_line.buffer;

	switch (c) {
	case ED_SEARCH_NEXT_HISTORY:
		return ed_search_next_history(el, 0);
	case ED_SEARCH_PREV_HISTORY:
		return ed_search_prev_history(el, 0);
	default:
		return CC_ERROR;
	}
}